

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascbin-cursor.c
# Opt level: O2

int coda_ascbin_cursor_get_num_elements(coda_cursor *cursor,long *num_elements)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  coda_type *pcVar4;
  int i;
  ulong uVar5;
  int64_t var_dim;
  char s [21];
  
  pcVar4 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
  if (99 < pcVar4->format) {
    pcVar4 = *(coda_type **)&pcVar4->type_class;
  }
  if (pcVar4->type_class == 1) {
    pcVar2 = *(char **)&pcVar4[1].type_class;
    if (pcVar2 == (char *)0xffffffffffffffff) {
      lVar3 = 1;
      uVar5 = 0;
      do {
        if ((long)*(int *)&pcVar4[1].name <= (long)uVar5) {
          *num_elements = lVar3;
          return 0;
        }
        pcVar2 = (&pcVar4[1].description)[uVar5];
        if ((&pcVar4[1].description)[uVar5] == (char *)0xffffffffffffffff) {
          iVar1 = coda_expression_eval_integer
                            ((coda_expression *)(&pcVar4[2].bit_size)[uVar5],cursor,&var_dim);
          if (iVar1 != 0) {
            coda_add_error_message(" for dim[%d] expression",uVar5 & 0xffffffff);
LAB_00119cf1:
            coda_cursor_add_to_error_message(cursor);
            return -1;
          }
          pcVar2 = (char *)var_dim;
          if (var_dim < 0) {
            coda_str64(var_dim,s);
            coda_set_error(-300,
                           "product error detected (invalid array size - calculated array size = %s)"
                           ,s);
            goto LAB_00119cf1;
          }
        }
        lVar3 = lVar3 * (long)pcVar2;
        uVar5 = uVar5 + 1;
      } while( true );
    }
  }
  else {
    if (pcVar4->type_class != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascbin-cursor.c"
                    ,0x343,"int coda_ascbin_cursor_get_num_elements(const coda_cursor *, long *)");
    }
    pcVar2 = pcVar4[1].name;
  }
  *num_elements = (long)pcVar2;
  return 0;
}

Assistant:

int coda_ascbin_cursor_get_num_elements(const coda_cursor *cursor, long *num_elements)
{
    coda_type *type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);

    switch (type->type_class)
    {
        case coda_record_class:
            *num_elements = ((coda_type_record *)type)->num_fields;
            break;
        case coda_array_class:
            {
                coda_type_array *array = (coda_type_array *)type;

                if (array->num_elements != -1)
                {
                    *num_elements = array->num_elements;
                }
                else
                {
                    long n;
                    int i;

                    /* count the number of elements in array */

                    n = 1;
                    for (i = 0; i < array->num_dims; i++)
                    {
                        if (array->dim[i] == -1)
                        {
                            int64_t var_dim;

                            if (coda_expression_eval_integer(array->dim_expr[i], cursor, &var_dim) != 0)
                            {
                                coda_add_error_message(" for dim[%d] expression", i);
                                coda_cursor_add_to_error_message(cursor);
                                return -1;
                            }
                            if (var_dim < 0)
                            {
                                char s[21];

                                coda_str64(var_dim, s);
                                coda_set_error(CODA_ERROR_PRODUCT, "product error detected (invalid array size - "
                                               "calculated array size = %s)", s);
                                coda_cursor_add_to_error_message(cursor);
                                return -1;
                            }
                            n *= (long)var_dim;
                        }
                        else
                        {
                            n *= array->dim[i];
                        }
                    }
                    *num_elements = n;
                }
            }
            break;
        default:
            assert(0);
            exit(1);
    }

    return 0;
}